

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.h
# Opt level: O0

void __thiscall TPZCompElDisc::SetFalseUseQsiEta(TPZCompElDisc *this)

{
  int iVar1;
  TPZGeoEl *pTVar2;
  TPZGeoEl *pTVar3;
  long *in_RDI;
  long lVar4;
  TPZManVector<double,_3> centerqsi;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  double *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  TPZManVector<double,_3> *in_stack_ffffffffffffffb0;
  undefined1 local_40 [64];
  
  *(undefined1 *)(in_RDI + 10) = 0;
  pTVar2 = TPZCompEl::Reference
                     ((TPZCompEl *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  (**(code **)(*(long *)pTVar2 + 0x210))();
  TPZManVector<double,_3>::TPZManVector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pTVar2 = TPZCompEl::Reference
                     ((TPZCompEl *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pTVar3 = TPZCompEl::Reference
                     ((TPZCompEl *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar1 = (**(code **)(*(long *)pTVar3 + 0xf0))();
  (**(code **)(*(long *)pTVar2 + 0x260))(pTVar2,iVar1 + -1,local_40);
  TPZManVector<double,_3>::Resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)CONCAT44(iVar1,in_stack_ffffffffffffff88));
  (**(code **)(*(long *)pTVar2 + 0x228))(pTVar2,local_40,in_RDI + 0xc);
  lVar4 = (**(code **)(*in_RDI + 0x348))();
  in_RDI[9] = lVar4;
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)pTVar2);
  return;
}

Assistant:

void SetFalseUseQsiEta(){
        fUseQsiEta = false;
        TPZManVector<REAL,3> centerqsi(Reference()->Dimension(),0);
        Reference()->CenterPoint(Reference()->NSides()-1,centerqsi);
        fCenterPoint.Resize(3);
        Reference()->X(centerqsi,fCenterPoint);
        fConstC = NormalizeConst();
    }